

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall QWidgetTextControlPrivate::updateCurrentCharFormat(QWidgetTextControlPrivate *this)

{
  QWidgetTextControl *this_00;
  char cVar1;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControl **)&this->field_0x8;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::charFormat();
  cVar1 = QTextFormat::operator==((QTextFormat *)local_38,&(this->lastCharFormat).super_QTextFormat)
  ;
  if (cVar1 == '\0') {
    QTextFormat::operator=(&(this->lastCharFormat).super_QTextFormat,(QTextFormat *)local_38);
    QWidgetTextControl::currentCharFormatChanged(this_00,(QTextCharFormat *)local_38);
    QWidgetTextControl::microFocusChanged(this_00);
  }
  QTextFormat::~QTextFormat((QTextFormat *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::updateCurrentCharFormat()
{
    Q_Q(QWidgetTextControl);

    QTextCharFormat fmt = cursor.charFormat();
    if (fmt == lastCharFormat)
        return;
    lastCharFormat = fmt;

    emit q->currentCharFormatChanged(fmt);
    emit q->microFocusChanged();
}